

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_tail_fixup(ASMState *as,TraceNo lnk)

{
  ushort uVar1;
  MCode *pMVar2;
  MCode MVar3;
  uint uVar4;
  MCode MVar5;
  int local_68;
  MCode *p1;
  MCode *pMStack_50;
  int32_t spadj;
  MCode *q;
  MCode *target;
  MCode *p;
  TraceNo lnk_local;
  ASMState *as_local;
  ptrdiff_t delta;
  
  pMVar2 = as->mctop;
  uVar1 = as->T->spadjust;
  uVar4 = (uint)uVar1;
  if (uVar4 == 0) {
    target = pMVar2 + -7;
  }
  else {
    MVar5 = (MCode)uVar1;
    if (uVar4 == (int)(char)MVar5) {
      pMVar2[-9] = MVar5;
      target = pMVar2 + -3;
    }
    else {
      *(uint *)(pMVar2 + -9) = uVar4;
      target = pMVar2;
    }
    pMVar2[-0xc] = 'H';
    MVar3 = 0x81;
    if (uVar4 == (int)(char)MVar5) {
      MVar3 = 0x83;
    }
    pMVar2[-0xb] = MVar3;
    pMVar2[-10] = 0xc4;
  }
  if (lnk == 0) {
    local_68 = 0x14027f;
  }
  else {
    local_68 = (int)*(undefined8 *)(as->J->trace[lnk].gcptr64 + 0x58);
  }
  *(int *)(target + -4) = local_68 - (int)target;
  target[-5] = 0xe9;
  pMStack_50 = as->mctop;
  while (pMStack_50 = pMStack_50 + -1, target <= pMStack_50) {
    *pMStack_50 = 0x90;
  }
  as->mctop = target;
  return;
}

Assistant:

static void asm_tail_fixup(ASMState *as, TraceNo lnk)
{
  /* Note: don't use as->mcp swap + emit_*: emit_op overwrites more bytes. */
  MCode *p = as->mctop;
  MCode *target, *q;
  int32_t spadj = as->T->spadjust;
  if (spadj == 0) {
    p -= LJ_64 ? 7 : 6;
  } else {
    MCode *p1;
    /* Patch stack adjustment. */
    if (checki8(spadj)) {
      p -= 3;
      p1 = p-6;
      *p1 = (MCode)spadj;
    } else {
      p1 = p-9;
      *(int32_t *)p1 = spadj;
    }
#if LJ_64
    p1[-3] = 0x48;
#endif
    p1[-2] = (MCode)(checki8(spadj) ? XI_ARITHi8 : XI_ARITHi);
    p1[-1] = MODRM(XM_REG, XOg_ADD, RID_ESP);
  }
  /* Patch exit branch. */
  target = lnk ? traceref(as->J, lnk)->mcode : (MCode *)lj_vm_exit_interp;
  *(int32_t *)(p-4) = jmprel(as->J, p, target);
  p[-5] = XI_JMP;
  /* Drop unused mcode tail. Fill with NOPs to make the prefetcher happy. */
  for (q = as->mctop-1; q >= p; q--)
    *q = XI_NOP;
  as->mctop = p;
}